

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O1

void __thiscall SQVM::Mark(SQVM *this,SQCollectable **chain)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  
  uVar1 = (this->super_SQCollectable).super_SQRefCounted._uiRef;
  if (-1 < (int)uVar1) {
    (this->super_SQCollectable).super_SQRefCounted._uiRef = uVar1 | 0x80000000;
    SQSharedState::MarkObject(&this->_lasterror,(SQCollectable_conflict **)chain);
    SQSharedState::MarkObject(&this->_errorhandler,(SQCollectable_conflict **)chain);
    SQSharedState::MarkObject(&this->_debughook_closure,(SQCollectable_conflict **)chain);
    SQSharedState::MarkObject(&this->_roottable,(SQCollectable_conflict **)chain);
    SQSharedState::MarkObject(&this->temp_reg,(SQCollectable_conflict **)chain);
    if ((this->_stack)._size != 0) {
      lVar2 = 0;
      uVar1 = 0;
      do {
        SQSharedState::MarkObject
                  ((SQObjectPtr *)((long)&(((this->_stack)._vals)->super_SQObject)._type + lVar2),
                   (SQCollectable_conflict **)chain);
        uVar1 = uVar1 + 1;
        lVar2 = lVar2 + 0x10;
      } while (uVar1 < (this->_stack)._size);
    }
    if (0 < this->_callsstacksize) {
      lVar3 = 0x10;
      lVar2 = 0;
      do {
        SQSharedState::MarkObject
                  ((SQObjectPtr *)((long)&this->_callsstack->_ip + lVar3),
                   (SQCollectable_conflict **)chain);
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x48;
      } while (lVar2 < this->_callsstacksize);
    }
    SQCollectable::RemoveFromChain(&this->_sharedstate->_gc_chain,(SQCollectable_conflict *)this);
    SQCollectable::AddToChain((SQCollectable_conflict **)chain,(SQCollectable_conflict *)this);
    return;
  }
  return;
}

Assistant:

void SQVM::Mark(SQCollectable **chain)
{
    START_MARK()
        SQSharedState::MarkObject(_lasterror,chain);
        SQSharedState::MarkObject(_errorhandler,chain);
        SQSharedState::MarkObject(_debughook_closure,chain);
        SQSharedState::MarkObject(_roottable, chain);
        SQSharedState::MarkObject(temp_reg, chain);
        for(SQUnsignedInteger i = 0; i < _stack.size(); i++) SQSharedState::MarkObject(_stack[i], chain);
        for(SQInteger k = 0; k < _callsstacksize; k++) SQSharedState::MarkObject(_callsstack[k]._closure, chain);
    END_MARK()
}